

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_context_open_client__jack(ma_context *pContext,ma_jack_client_t **ppClient)

{
  ma_proc p_Var1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ma_jack_client_t *pmVar6;
  ma_proc p_Var7;
  long lVar8;
  ma_result mVar9;
  ma_jack_status_t status;
  char clientName [256];
  undefined1 local_11c [4];
  char local_118 [256];
  
  if (ppClient == (ma_jack_client_t **)0x0) {
    __assert_fail("ppClient != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x509a,
                  "ma_result ma_context_open_client__jack(ma_context *, ma_jack_client_t **)");
  }
  *ppClient = (ma_jack_client_t *)0x0;
  uVar3 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)();
  p_Var1 = (pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max;
  p_Var7 = (ma_proc)"miniaudio";
  if (p_Var1 != (ma_proc)0x0) {
    p_Var7 = p_Var1;
  }
  if (uVar3 != 0) {
    uVar2 = 0x100;
    if (uVar3 < 0x100) {
      uVar2 = uVar3;
    }
    lVar4 = 0;
    lVar8 = (ulong)uVar2 - 1;
    lVar5 = lVar4;
    if (lVar8 != 0) {
      do {
        lVar5 = lVar4;
        if (p_Var7[lVar4] == (_func_void)0x0) break;
        local_118[lVar4] = (char)p_Var7[lVar4];
        lVar4 = lVar4 + 1;
        lVar5 = lVar8;
      } while (lVar8 != lVar4);
    }
    local_118[lVar5] = '\0';
  }
  mVar9 = 0;
  pmVar6 = (ma_jack_client_t *)
           (*(pContext->field_21).alsa.snd_pcm_open)
                     (local_118,(ulong)((pContext->field_21).jack.tryStartServer == 0),local_11c,0);
  if (pmVar6 == (ma_jack_client_t *)0x0) {
    mVar9 = -0x12d;
  }
  else {
    *ppClient = pmVar6;
  }
  return mVar9;
}

Assistant:

static ma_result ma_context_open_client__jack(ma_context* pContext, ma_jack_client_t** ppClient)
{
    size_t maxClientNameSize;
    char clientName[256];
    ma_jack_status_t status;
    ma_jack_client_t* pClient;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(ppClient != NULL);

    if (ppClient) {
        *ppClient = NULL;
    }

    maxClientNameSize = ((ma_jack_client_name_size_proc)pContext->jack.jack_client_name_size)(); /* Includes null terminator. */
    ma_strncpy_s(clientName, ma_min(sizeof(clientName), maxClientNameSize), (pContext->jack.pClientName != NULL) ? pContext->jack.pClientName : "miniaudio", (size_t)-1);

    pClient = ((ma_jack_client_open_proc)pContext->jack.jack_client_open)(clientName, (pContext->jack.tryStartServer) ? 0 : ma_JackNoStartServer, &status, NULL);
    if (pClient == NULL) {
        return MA_FAILED_TO_OPEN_BACKEND_DEVICE;
    }

    if (ppClient) {
        *ppClient = pClient;
    }

    return MA_SUCCESS;
}